

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void SimpleString::padStringsToSameLength(SimpleString *str1,SimpleString *str2,char padCharacter)

{
  size_t sVar1;
  size_t sVar2;
  SimpleString *this;
  undefined1 in_DL;
  SimpleString *in_RSI;
  char pad [2];
  SimpleString *in_stack_ffffffffffffffa8;
  SimpleString *in_stack_ffffffffffffffd0;
  SimpleString *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  char in_stack_ffffffffffffffe7;
  undefined5 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffed;
  undefined1 in_stack_ffffffffffffffee;
  
  sVar1 = size((SimpleString *)0x20b5fe);
  sVar2 = size((SimpleString *)0x20b60d);
  if (sVar2 < sVar1) {
    padStringsToSameLength
              (in_RSI,(SimpleString *)
                      CONCAT17(in_DL,CONCAT16(in_stack_ffffffffffffffee,
                                              CONCAT15(in_stack_ffffffffffffffed,
                                                       in_stack_ffffffffffffffe8))),
               in_stack_ffffffffffffffe7);
  }
  else {
    this = (SimpleString *)size((SimpleString *)0x20b647);
    size((SimpleString *)0x20b656);
    SimpleString((SimpleString *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                 (char *)in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
    operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    operator=(this,in_stack_ffffffffffffffa8);
    ~SimpleString((SimpleString *)0x20b6a3);
    ~SimpleString((SimpleString *)0x20b6ad);
  }
  return;
}

Assistant:

void SimpleString::padStringsToSameLength(SimpleString& str1, SimpleString& str2, char padCharacter)
{
    if (str1.size() > str2.size()) {
        padStringsToSameLength(str2, str1, padCharacter);
        return;
    }

    char pad[2];
    pad[0] = padCharacter;
    pad[1] = 0;
    str1 = SimpleString(pad, str2.size() - str1.size()) + str1;
}